

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O0

void __thiscall Fl_Window::xclass(Fl_Window *this,char *xc)

{
  char *pcVar1;
  char *xc_local;
  Fl_Window *this_local;
  
  if (this->xclass_ != (char *)0x0) {
    free(this->xclass_);
    this->xclass_ = (char *)0x0;
  }
  if (xc != (char *)0x0) {
    pcVar1 = strdup(xc);
    this->xclass_ = pcVar1;
    if (default_xclass_ == (char *)0x0) {
      default_xclass(xc);
    }
  }
  return;
}

Assistant:

void Fl_Window::xclass(const char *xc) 
{
  if (xclass_) {
    free(xclass_);
    xclass_ = 0L;
  }
  if (xc) {
    xclass_ = strdup(xc);
    if (!default_xclass_) {
      default_xclass(xc);
    }
  }
}